

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::anon_unknown_1::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  second_type p_Var1;
  FileDescriptor *pFVar2;
  DescriptorPool *pDVar3;
  DescriptorPool *pDVar4;
  LogMessage *pLVar5;
  string *psVar6;
  LogFinisher local_d9;
  LogMessage local_d8;
  GeneratedMessageFactory *local_a0;
  Message *result;
  WriterMutexLock lock;
  LogMessage local_88;
  first_type local_50;
  second_type local_48;
  RegistrationFunc *registration_func;
  GeneratedMessageFactory *local_30;
  Message *result_1;
  ReaderMutexLock lock_1;
  Descriptor *type_local;
  GeneratedMessageFactory *this_local;
  
  lock_1.mu_ = (Mutex *)type;
  internal::MutexLock::MutexLock((MutexLock *)&result_1,&this->mutex_);
  local_30 = (GeneratedMessageFactory *)
             FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                       (&this->type_map_,(first_type *)&lock_1);
  if (local_30 != (GeneratedMessageFactory *)0x0) {
    this_local = local_30;
  }
  registration_func._0_4_ = (uint)(local_30 != (GeneratedMessageFactory *)0x0);
  internal::MutexLock::~MutexLock((MutexLock *)&result_1);
  if ((uint)registration_func == 0) {
    pFVar2 = Descriptor::file((Descriptor *)lock_1.mu_);
    pDVar3 = FileDescriptor::pool(pFVar2);
    pDVar4 = DescriptorPool::generated_pool();
    if (pDVar3 == pDVar4) {
      pFVar2 = Descriptor::file((Descriptor *)lock_1.mu_);
      FileDescriptor::name_abi_cxx11_(pFVar2);
      local_50 = (first_type)std::__cxx11::string::c_str();
      local_48 = FindPtrOrNull<google::protobuf::hash_map<char_const*,void(*)(std::__cxx11::string_const&),google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>>>>
                           (&this->file_map_,&local_50);
      if (local_48 == (second_type)0x0) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                   ,0x14e);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_88,
                            "File appears to be in generated pool but wasn\'t registered: ");
        pFVar2 = Descriptor::file((Descriptor *)lock_1.mu_);
        psVar6 = FileDescriptor::name_abi_cxx11_(pFVar2);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar6);
        internal::LogFinisher::operator=((LogFinisher *)((long)&lock.mu_ + 7),pLVar5);
        internal::LogMessage::~LogMessage(&local_88);
        this_local = (GeneratedMessageFactory *)0x0;
      }
      else {
        internal::MutexLock::MutexLock((MutexLock *)&result,&this->mutex_);
        local_a0 = (GeneratedMessageFactory *)
                   FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (&this->type_map_,(first_type *)&lock_1);
        p_Var1 = local_48;
        if (local_a0 == (GeneratedMessageFactory *)0x0) {
          pFVar2 = Descriptor::file((Descriptor *)lock_1.mu_);
          psVar6 = FileDescriptor::name_abi_cxx11_(pFVar2);
          (*p_Var1)(psVar6);
          local_a0 = (GeneratedMessageFactory *)
                     FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                               (&this->type_map_,(first_type *)&lock_1);
        }
        if (local_a0 == (GeneratedMessageFactory *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                     ,0x15f);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_d8,"Type appears to be in generated pool but wasn\'t ");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"registered: ");
          psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)lock_1.mu_);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar6);
          internal::LogFinisher::operator=(&local_d9,pLVar5);
          internal::LogMessage::~LogMessage(&local_d8);
        }
        this_local = local_a0;
        registration_func._0_4_ = 1;
        internal::MutexLock::~MutexLock((MutexLock *)&result);
      }
    }
    else {
      this_local = (GeneratedMessageFactory *)0x0;
    }
  }
  return (Message *)this_local;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  RegistrationFunc* registration_func =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_func == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: " << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    registration_func(type->file()->name());
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}